

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void safefree(void *ptr)

{
  void *ptr_local;
  
  if (ptr != (void *)0x0) {
    free(ptr);
  }
  return;
}

Assistant:

void safefree(void *ptr)
{
    if (ptr) {
#ifdef MINEFIELD
        minefield_c_free(ptr);
#else
        free(ptr);
#endif
    }
}